

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::EnableLanguage
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *lang,bool optional)

{
  int iVar1;
  undefined4 extraout_var;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"CMAKE_CFG_INTDIR",&local_39);
  iVar1 = (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0xd])();
  AddDefinition(this,&local_38,(char *)CONCAT44(extraout_var,iVar1));
  std::__cxx11::string::~string((string *)&local_38);
  (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0xb])
            (this->GlobalGenerator,lang,this,(ulong)optional);
  return;
}

Assistant:

void cmMakefile::EnableLanguage(std::vector<std::string> const &  lang,
                               bool optional)
{
  this->AddDefinition("CMAKE_CFG_INTDIR",
                      this->GetGlobalGenerator()->GetCMakeCFGIntDir());
  this->GetGlobalGenerator()->EnableLanguage(lang, this, optional);
}